

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::getSyncPointListString
          (CLIntercept *this,cl_uint numSyncPoints,cl_sync_point_khr *syncPointList,string *str)

{
  string *in_RCX;
  long in_RDX;
  uint in_ESI;
  char s [256];
  cl_uint i;
  ostringstream ss;
  char local_2d8 [268];
  uint local_1cc;
  string local_1c8 [48];
  ostringstream local_198 [376];
  string *local_20;
  long local_18;
  uint local_c;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::operator<<((ostream *)local_198,"( size = ");
  std::ostream::operator<<(local_198,local_c);
  std::operator<<((ostream *)local_198," )[ ");
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator+=(local_20,local_1c8);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  if (local_18 != 0) {
    for (local_1cc = 0; local_1cc < local_c; local_1cc = local_1cc + 1) {
      if (local_1cc != 0) {
        std::__cxx11::string::operator+=(local_20,", ");
      }
      snprintf(local_2d8,0x100,"%u",(ulong)*(uint *)(local_18 + (ulong)local_1cc * 4));
      std::__cxx11::string::operator+=(local_20,local_2d8);
    }
  }
  std::__cxx11::string::operator+=(local_20," ]");
  return;
}

Assistant:

void CLIntercept::getSyncPointListString(
    cl_uint numSyncPoints,
    const cl_sync_point_khr* syncPointList,
    std::string& str ) const
{
    {
        std::ostringstream  ss;
        ss << "( size = ";
        ss << numSyncPoints;
        ss << " )[ ";
        str += ss.str();
    }
    if( syncPointList )
    {
        for( cl_uint i = 0; i < numSyncPoints; i++ )
        {
            if( i > 0 )
            {
                str += ", ";
            }
            {
                char    s[256];
                CLI_SPRINTF( s, 256, "%u", syncPointList[i] );
                str += s;
            }
        }
    }
    str += " ]";
}